

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-async-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase271::run(TestCase271 *this)

{
  Builder builder;
  PromiseNode *pPVar1;
  ArrayPtr<const_capnp::word> *pAVar2;
  Iface *pIVar3;
  long *plVar4;
  ElementCount index;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar5;
  Own<kj::AsyncOutputStream> output;
  PipeWithSmallBuffer fds;
  AsyncIoContext ioContext;
  Builder list;
  Thread thread;
  Builder root;
  Builder element;
  TestMessageBuilder message;
  Own<kj::_::PromiseNode> local_370;
  undefined8 *local_360;
  ArrayPtr<const_capnp::word> *local_358;
  PipeWithSmallBuffer local_350;
  Function<void_()> local_348;
  undefined8 *local_338;
  long *local_330;
  undefined8 *local_328;
  long *local_320;
  WaitScope *local_318;
  ListBuilder local_308;
  Thread local_2e0;
  StructBuilder local_2c8;
  PointerBuilder local_298;
  WirePointer *in_stack_fffffffffffffd80;
  undefined8 in_stack_fffffffffffffd88;
  undefined1 in_stack_fffffffffffffd90 [24];
  TestMessageBuilder local_128;
  
  PipeWithSmallBuffer::PipeWithSmallBuffer(&local_350);
  kj::setupAsyncIo();
  (**(code **)(*local_330 + 8))(&local_360,local_330,local_350.fds[1]);
  MallocMessageBuilder::MallocMessageBuilder(&local_128.super_MallocMessageBuilder,0,FIXED_SIZE);
  local_128.super_MallocMessageBuilder.super_MessageBuilder._vptr_MessageBuilder =
       (_func_int **)&PTR__TestMessageBuilder_0060d070;
  local_128.desiredSegmentCount = 1;
  MessageBuilder::getRootInternal((Builder *)&local_308,(MessageBuilder *)&local_128);
  local_298.pointer = (WirePointer *)local_308.ptr;
  local_298.segment = local_308.segment;
  local_298.capTable = local_308.capTable;
  PointerBuilder::getStruct(&local_2c8,&local_298,(StructSize)0x140006,(word *)0x0);
  local_298.pointer = local_2c8.pointers + 0x11;
  local_298.segment = local_2c8.segment;
  local_298.capTable = local_2c8.capTable;
  PointerBuilder::initStructList(&local_308,&local_298,0x10,(StructSize)0x140006);
  if (local_308.elementCount != 0) {
    index = 0;
    do {
      ListBuilder::getStructElement((StructBuilder *)&local_298,&local_308,index);
      builder._builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffd88;
      builder._builder.segment = (SegmentBuilder *)in_stack_fffffffffffffd80;
      builder._builder.data = (void *)in_stack_fffffffffffffd90._0_8_;
      builder._builder.pointers = (WirePointer *)in_stack_fffffffffffffd90._8_8_;
      builder._builder.dataSize = in_stack_fffffffffffffd90._16_4_;
      builder._builder.pointerCount = in_stack_fffffffffffffd90._20_2_;
      builder._builder._38_2_ = in_stack_fffffffffffffd90._22_2_;
      initTestMessage(builder);
      index = index + 1;
    } while (local_308.elementCount != index);
  }
  local_348.impl.ptr = (Iface *)operator_new(0x18);
  (local_348.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___0060d278;
  local_348.impl.ptr[1]._vptr_Iface = (_func_int **)&local_350;
  local_348.impl.ptr[2]._vptr_Iface = (_func_int **)&local_308;
  local_348.impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<void()>::Impl<capnp::_::(anonymous_namespace)::TestCase271::run()::$_0>>
        ::instance;
  kj::Thread::Thread(&local_2e0,&local_348);
  pIVar3 = local_348.impl.ptr;
  if (local_348.impl.ptr != (Iface *)0x0) {
    local_348.impl.ptr = (Iface *)0x0;
    (**(local_348.impl.disposer)->_vptr_Disposer)
              (local_348.impl.disposer,pIVar3->_vptr_Iface[-2] + (long)&pIVar3->_vptr_Iface);
  }
  pAVar2 = local_358;
  AVar5 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&local_128);
  AVar5.size_ = (size_t)AVar5.ptr;
  AVar5.ptr = pAVar2;
  writeMessage((AsyncOutputStream *)&local_370,AVar5);
  local_298.segment = (SegmentBuilder *)((ulong)local_298.segment & 0xffffffffffffff00);
  kj::_::waitImpl(&local_370,(ExceptionOrValue *)&local_298,local_318);
  if ((char)local_298.segment != '\0') {
    kj::throwRecoverableException((Exception *)&local_298.capTable,0);
    if ((char)local_298.segment == '\x01') {
      kj::Exception::~Exception((Exception *)&local_298.capTable);
    }
    pPVar1 = local_370.ptr;
    if (local_370.ptr != (PromiseNode *)0x0) {
      local_370.ptr = (PromiseNode *)0x0;
      (**(local_370.disposer)->_vptr_Disposer)
                (local_370.disposer,pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode
                );
    }
    kj::Thread::~Thread(&local_2e0);
    TestMessageBuilder::~TestMessageBuilder(&local_128);
    pAVar2 = local_358;
    if (local_358 != (ArrayPtr<const_capnp::word> *)0x0) {
      local_358 = (ArrayPtr<const_capnp::word> *)0x0;
      (**(code **)*local_360)(local_360,(long)&pAVar2->ptr + pAVar2->ptr[-2].content);
    }
    plVar4 = local_320;
    if (local_320 != (long *)0x0) {
      local_320 = (long *)0x0;
      (**(code **)*local_328)(local_328,(long)plVar4 + *(long *)(*plVar4 + -0x10));
    }
    plVar4 = local_330;
    if (local_330 != (long *)0x0) {
      local_330 = (long *)0x0;
      (**(code **)*local_338)(local_338,(long)plVar4 + *(long *)(*plVar4 + -0x10));
    }
    PipeWithSmallBuffer::~PipeWithSmallBuffer(&local_350);
    return;
  }
  kj::_::unreachable();
}

Assistant:

TEST(SerializeAsyncTest, WriteAsync) {
  PipeWithSmallBuffer fds;
  auto ioContext = kj::setupAsyncIo();
  auto output = ioContext.lowLevelProvider->wrapOutputFd(fds[1]);

  TestMessageBuilder message(1);
  auto root = message.getRoot<TestAllTypes>();
  auto list = root.initStructList(16);
  for (auto element: list) {
    initTestMessage(element);
  }

  kj::Thread thread([&]() {
    SocketInputStream input(fds[0]);
    InputStreamMessageReader reader(input);
    auto listReader = reader.getRoot<TestAllTypes>().getStructList();
    EXPECT_EQ(list.size(), listReader.size());
    for (auto element: listReader) {
      checkTestMessage(element);
    }
  });

  writeMessage(*output, message).wait(ioContext.waitScope);
}